

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffcrimll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = fptr->HDUposition;
  pFVar1 = fptr->Fptr;
  if (iVar2 != pFVar1->curhdu) {
    ffmahd(fptr,iVar2 + 1,(int *)0x0,status);
    pFVar1 = fptr->Fptr;
    iVar2 = pFVar1->curhdu;
  }
  if (pFVar1->headend != pFVar1->headstart[iVar2]) {
    ffcrhd(fptr,status);
  }
  ffphprll(fptr,1,bitpix,naxis,naxes,0,1,1,status);
  return *status;
}

Assistant:

int ffcrimll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  create an IMAGE extension following the current HDU. If the
  current HDU is empty (contains no header keywords), then simply
  write the required image (or primary array) keywords to the current
  HDU. 
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* create new extension if current header is not empty */
    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        ffcrhd(fptr, status);

    /* write the required header keywords */
    ffphprll(fptr, TRUE, bitpix, naxis, naxes, 0, 1, TRUE, status);

    return(*status);
}